

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void slang::ast::ParameterSymbol::fromSyntax
               (Scope *scope,ParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::ParameterSymbol_*> *results)

{
  undefined1 *puVar1;
  Compilation *this;
  DeclaratorSyntax *decl;
  ParameterSymbol *this_00;
  DiagCode code;
  SourceLocation loc;
  const_iterator __begin2;
  ParameterSymbol *param;
  bool local_72;
  bool local_71;
  SourceLocation local_70;
  iterator_base<const_slang::syntax::DeclaratorSyntax_*> local_68;
  ulong local_58;
  ParameterDeclarationSyntax *local_50;
  SmallVectorBase<slang::ast::ParameterSymbol_*> *local_48;
  string_view local_40;
  
  local_68.index = 0;
  local_58 = (syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1;
  local_72 = isPort;
  local_71 = isLocal;
  local_68.list = &syntax->declarators;
  local_50 = syntax;
  local_48 = results;
  do {
    if ((local_68.list == &syntax->declarators) && (local_68.index == local_58)) {
      return;
    }
    decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
           iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&local_68);
    local_70 = parsing::Token::location(&decl->name);
    this = scope->compilation;
    local_40 = parsing::Token::valueText(&decl->name);
    this_00 = BumpAllocator::
              emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&,bool&,bool&>
                        (&this->super_BumpAllocator,&local_40,&local_70,&local_71,&local_72);
    local_40._M_len = (size_t)this_00;
    (this_00->super_ValueSymbol).declaredType.typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(local_50->type).ptr;
    puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
    if (decl->initializer == (EqualsValueClauseSyntax *)0x0) {
      if (local_72 == false) {
        code.subsystem = Declarations;
        code.code = 0xe;
      }
      else {
        if (local_71 != true) goto LAB_002438f3;
        code.subsystem = Declarations;
        code.code = 0x6a;
      }
      Scope::addDiag(scope,code,local_70);
    }
LAB_002438f3:
    SmallVectorBase<slang::ast::ParameterSymbol*>::emplace_back<slang::ast::ParameterSymbol*const&>
              ((SmallVectorBase<slang::ast::ParameterSymbol*> *)local_48,
               (ParameterSymbol **)&local_40);
    local_68.index = local_68.index + 1;
  } while( true );
}

Assistant:

void ParameterSymbol::fromSyntax(const Scope& scope, const ParameterDeclarationSyntax& syntax,
                                 bool isLocal, bool isPort,
                                 SmallVectorBase<ParameterSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<ParameterSymbol>(decl->name.valueText(), loc,
                                                                     isLocal, isPort);
        param->setDeclaredType(*syntax.type);
        param->setFromDeclarator(*decl);

        if (!decl->initializer) {
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }

        results.push_back(param);
    }
}